

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitStructNew
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,StructNew *curr)

{
  Flow *pFVar1;
  Field *pFVar2;
  long lVar3;
  Literal *pLVar4;
  undefined8 uVar5;
  Field *field;
  long *plVar6;
  Type this_00;
  int iVar7;
  Field *pFVar8;
  Field *pFVar9;
  bool bVar10;
  HeapType heapType;
  HeapType local_e8 [3];
  Literal local_d0;
  undefined1 local_b8 [8];
  Literals data;
  GCData *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  StructNew *local_68;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *local_60;
  Literal *local_58;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *local_50;
  long *local_48;
  Flow *local_40;
  undefined1 local_31;
  
  local_68 = curr;
  local_60 = this;
  local_40 = __return_storage_ptr__;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id != 1) {
    data.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)&(curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type;
    wasm::Type::getHeapType();
    plVar6 = (long *)wasm::HeapType::getStruct();
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)local_b8,plVar6[1] - *plVar6 >> 4);
    lVar3 = *plVar6;
    local_48 = plVar6;
    if (plVar6[1] != lVar3) {
      local_50 = &(local_40->values).super_SmallVector<wasm::Literal,_1UL>.flexible;
      field = (Field *)&(local_40->values).super_SmallVector<wasm::Literal,_1UL>.fixed;
      pFVar2 = (Field *)0x1;
      pFVar9 = (Field *)0x0;
      local_58 = (Literal *)field;
      do {
        pFVar8 = pFVar2;
        pFVar1 = local_40;
        iVar7 = (int)pFVar8;
        if ((local_68->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            == 0) {
          wasm::Literal::makeZero((Type)local_e8);
          pLVar4 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   (long)pFVar9 * 0x18);
          if (iVar7 == 1) {
            pLVar4 = (Literal *)&data;
          }
          wasm::Literal::operator=(pLVar4,(Literal *)local_e8);
          this_00.id = (uintptr_t)local_e8;
        }
        else {
          if ((Field *)(local_68->operands).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       usedElements <= pFVar9) goto LAB_0012ee23;
          visit(local_40,local_60,
                (local_68->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                [(long)pFVar9]);
          if ((pFVar1->breakTo).super_IString.str._M_str != (char *)0x0) goto LAB_0012ede9;
          pLVar4 = Flow::getSingleValue(pFVar1);
          wasm::Literal::Literal((Literal *)&heapType,pLVar4);
          truncateForPacking((Literal *)local_e8,
                             (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                             &heapType,(Literal *)((long)pFVar9 * 0x10 + lVar3),field);
          pLVar4 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   (long)pFVar9 * 0x18);
          if (iVar7 == 1) {
            pLVar4 = (Literal *)&data;
          }
          wasm::Literal::operator=(pLVar4,(Literal *)local_e8);
          wasm::Literal::~Literal((Literal *)local_e8);
          wasm::Literal::~Literal((Literal *)&heapType);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(local_50);
          this_00.id = (uintptr_t)local_58;
        }
        wasm::Literal::~Literal((Literal *)this_00.id);
        lVar3 = *local_48;
        field = (Field *)(local_48[1] - lVar3 >> 4);
        pFVar2 = (Field *)(ulong)(iVar7 + 1);
        pFVar9 = pFVar8;
      } while (pFVar8 < field);
    }
    local_e8[0].id = wasm::Type::getHeapType();
    local_78 = (GCData *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<wasm::GCData,std::allocator<wasm::GCData>,wasm::HeapType,wasm::Literals&>
              (&local_70,&local_78,(allocator<wasm::GCData> *)&local_31,local_e8,
               (Literals *)local_b8);
    uVar5 = wasm::Type::getHeapType();
    pFVar1 = local_40;
    wasm::Literal::Literal(&local_d0,&local_78,uVar5);
    Flow::Flow(pFVar1,&local_d0);
    wasm::Literal::~Literal(&local_d0);
    if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
    }
LAB_0012ede9:
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&data);
    return local_40;
  }
  local_48 = (long *)(curr->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                     usedElements;
  bVar10 = local_48 == (long *)0x0;
  if (!bVar10) {
    plVar6 = (long *)0x0;
    do {
      if ((long *)(local_68->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements <= plVar6) {
LAB_0012ee23:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      visit(__return_storage_ptr__,local_60,
            (local_68->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
            [(long)plVar6]);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
        if (!bVar10) {
          return local_40;
        }
        break;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible);
      wasm::Literal::~Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems);
      plVar6 = (long *)((long)plVar6 + 1);
      bVar10 = local_48 == plVar6;
    } while (!bVar10);
  }
  wasm::handle_unreachable
            ("unreachable but no unreachable child",
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
             ,0x602);
}

Assistant:

Flow visitStructNew(StructNew* curr) {
    NOTE_ENTER("StructNew");
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* operand : curr->operands) {
        auto value = self()->visit(operand);
        if (value.breaking()) {
          return value;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    const auto& fields = heapType.getStruct().fields;
    Literals data(fields.size());
    for (Index i = 0; i < fields.size(); i++) {
      auto& field = fields[i];
      if (curr->isWithDefault()) {
        data[i] = Literal::makeZero(field.type);
      } else {
        auto value = self()->visit(curr->operands[i]);
        if (value.breaking()) {
          return value;
        }
        data[i] = truncateForPacking(value.getSingleValue(), field);
      }
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }